

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O0

ly_bool lydict_val_eq(void *val1_p,void *val2_p,ly_bool UNUSED_mod,void *cb_data)

{
  char *__s2;
  int iVar1;
  size_t *len1;
  char *str2;
  char *str1;
  void *cb_data_local;
  ly_bool UNUSED_mod_local;
  void *val2_p_local;
  void *val1_p_local;
  
  if (val1_p == (void *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","val1_p","lydict_val_eq");
    val1_p_local._7_1_ = '\0';
  }
  else if (val2_p == (void *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","val2_p","lydict_val_eq");
    val1_p_local._7_1_ = '\0';
  }
  else if (cb_data == (void *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","cb_data","lydict_val_eq")
    ;
    val1_p_local._7_1_ = '\0';
  }
  else {
    __s2 = *val2_p;
    if (*val1_p == (char *)0x0) {
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","val1_p","lydict_val_eq"
            );
      val1_p_local._7_1_ = '\0';
    }
    else if (__s2 == (char *)0x0) {
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","val2_p","lydict_val_eq"
            );
      val1_p_local._7_1_ = '\0';
    }
    else {
      iVar1 = strncmp(*val1_p,__s2,*cb_data);
      if ((iVar1 == 0) && (__s2[*cb_data] == '\0')) {
        val1_p_local._7_1_ = '\x01';
      }
      else {
        val1_p_local._7_1_ = '\0';
      }
    }
  }
  return val1_p_local._7_1_;
}

Assistant:

static ly_bool
lydict_val_eq(void *val1_p, void *val2_p, ly_bool UNUSED(mod), void *cb_data)
{
    const char *str1, *str2;
    size_t *len1;

    LY_CHECK_ARG_RET(NULL, val1_p, val2_p, cb_data, 0);

    str1 = ((struct ly_dict_rec *)val1_p)->value;
    str2 = ((struct ly_dict_rec *)val2_p)->value;
    len1 = cb_data;

    LY_CHECK_ERR_RET(!str1, LOGARG(NULL, val1_p), 0);
    LY_CHECK_ERR_RET(!str2, LOGARG(NULL, val2_p), 0);

    if (!strncmp(str1, str2, *len1) && !str2[*len1]) {
        return 1;
    }

    return 0;
}